

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O0

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genDecl
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Schema schema,Reader name,
          uint64_t scopeId,Indent indent)

{
  ArrayDisposer **this_00;
  char cVar1;
  Reader type;
  Reader value;
  Reader type_00;
  Field field_00;
  size_t sVar2;
  bool bVar3;
  ReaderFor<bool> RVar4;
  Which WVar5;
  uint16_t uVar6;
  ElementSize EVar7;
  uint64_t uVar8;
  FieldList *delim;
  char *pcVar9;
  char *pcVar10;
  String *params;
  uint *params_1;
  Reader *value_00;
  Iterator IVar11;
  Reader RVar12;
  StringPtr SVar13;
  WirePointer *in_stack_fffffffffffff3f8;
  char (*in_stack_fffffffffffff408) [3];
  char (*in_stack_fffffffffffff430) [3];
  StringTree local_ab8;
  Maybe<capnp::InterfaceSchema::Method> local_a78;
  Schema local_a30;
  Reader local_a28;
  StringTree local_9f8;
  String local_9c0;
  CappedArray<char,_17UL> local_9a8;
  String local_988;
  Vector<kj::String> local_970;
  StringPtr local_950;
  undefined1 local_940 [8];
  String target;
  Reader local_8e8;
  StringPtr local_8a0;
  Reader local_890;
  undefined1 local_860 [8];
  Reader fieldName;
  Field field;
  undefined1 local_800 [8];
  Iterator __end4;
  undefined1 local_7e0 [8];
  Iterator __begin4;
  FieldList local_7c8;
  FieldList *local_790;
  FieldList *__range4;
  ReaderFor<DynamicTypeFor<FromReader<Reader_&>_>_> dynamic;
  undefined1 local_748 [7];
  bool targetsAll;
  Vector<kj::String> targets;
  Reader annotationProto;
  StringTree local_6f0;
  Reader local_6b8;
  Schema local_688;
  Type local_680;
  StringTree local_670;
  Maybe<capnp::InterfaceSchema::Method> local_630;
  Schema local_5e8;
  Reader local_5e0;
  StringTree local_5b0;
  CappedArray<char,_17UL> local_578;
  undefined1 local_558 [8];
  Reader constProto;
  StringTree local_518;
  anon_class_24_3_4192ed52 local_4e0;
  MethodList local_4c8;
  Array<capnp::InterfaceSchema::Method> local_490;
  Mapper<kj::Array<capnp::InterfaceSchema::Method>_> local_478;
  Array<kj::StringTree> local_460;
  size_t local_448;
  StringTree local_440;
  Schema local_408;
  StringTree local_400;
  size_t local_3c8;
  StringTree local_3c0;
  CappedArray<char,_17UL> local_388;
  Schema local_368;
  InterfaceSchema interface;
  StringTree local_350;
  anon_class_24_3_3dc5f356 local_318;
  Schema local_300;
  EnumerantList local_2f8;
  Array<capnp::EnumSchema::Enumerant> local_2c0;
  Mapper<kj::Array<capnp::EnumSchema::Enumerant>_> local_2a8;
  Array<kj::StringTree> local_290;
  size_t local_278;
  StringTree local_270;
  CappedArray<char,_17UL> local_238;
  uint local_214;
  Schema local_210;
  StringTree local_208;
  uint local_1cc;
  Schema local_1c8;
  Array<kj::StringTree> local_1c0;
  char *local_1a8;
  StringTree local_1a0;
  uint16_t local_166;
  int local_164;
  size_t local_160;
  StringTree local_158;
  size_t local_120;
  StringTree local_118;
  CappedArray<char,_17UL> local_e0;
  undefined1 local_c0 [8];
  Reader structProto;
  Fault f_1;
  Fault local_78;
  Fault f;
  Reader proto;
  uint64_t scopeId_local;
  CapnpcCapnpMain *this_local;
  char acStack_28 [8];
  Indent indent_local;
  Reader name_local;
  Schema schema_local;
  
  name_local.super_StringPtr.content.ptr = name.super_StringPtr.content.size_;
  acStack_28 = name.super_StringPtr.content.ptr;
  this_local._4_4_ = indent.amount;
  name_local.super_StringPtr.content.size_ = (size_t)schema.raw;
  Schema::getProto((Reader *)&f,(Schema *)&name_local.super_StringPtr.content.size_);
  uVar8 = capnp::schema::Node::Reader::getScopeId((Reader *)&f);
  if (uVar8 == scopeId) {
    WVar5 = capnp::schema::Node::Reader::which((Reader *)&f);
    params_1 = &switchD_0010ca0a::switchdataD_002260ac;
    switch(WVar5) {
    case FILE:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[30]>
                ((Fault *)&structProto._reader.nestingLimit,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnpc-capnp.c++"
                 ,0x219,FAILED,(char *)0x0,"\"Encountered nested file node.\"",
                 (char (*) [30])"Encountered nested file node.");
      kj::_::Debug::Fault::fatal((Fault *)&structProto._reader.nestingLimit);
    case STRUCT:
      capnp::schema::Node::Reader::getStruct((Reader *)local_c0,(Reader *)&f);
      uVar8 = capnp::schema::Node::Reader::getId((Reader *)&f);
      kj::hex(&local_e0,uVar8);
      local_120 = name_local.super_StringPtr.content.size_;
      genGenericParams(&local_118,this,(Schema)name_local.super_StringPtr.content.size_);
      local_160 = name_local.super_StringPtr.content.size_;
      genAnnotations(&local_158,this,(Schema)name_local.super_StringPtr.content.size_);
      uVar6 = capnp::schema::Node::Struct::Reader::getDataWordCount((Reader *)local_c0);
      local_164 = (uint)uVar6 << 3;
      local_166 = capnp::schema::Node::Struct::Reader::getPointerCount((Reader *)local_c0);
      EVar7 = capnp::schema::Node::Struct::Reader::getPreferredListEncoding((Reader *)local_c0);
      if (EVar7 == INLINE_COMPOSITE) {
        kj::strTree<>();
      }
      else {
        EVar7 = capnp::schema::Node::Struct::Reader::getPreferredListEncoding((Reader *)local_c0);
        local_1a8 = elementSizeName(this,EVar7);
        kj::strTree<char_const(&)[13],char_const*>
                  (&local_1a0,(kj *)", packed as ",(char (*) [13])&local_1a8,(char **)params_1);
      }
      local_1c8.raw =
           (RawBrandedSchema *)Schema::asStruct((Schema *)&name_local.super_StringPtr.content.size_)
      ;
      local_1cc = (uint)Indent::next((Indent *)((long)&this_local + 4));
      genStructFields(&local_1c0,this,(StructSchema)local_1c8.raw,(Indent)local_1cc);
      local_210.raw = (RawBrandedSchema *)name_local.super_StringPtr.content.size_;
      local_214 = (uint)Indent::next((Indent *)((long)&this_local + 4));
      genNestedDecls(&local_208,this,local_210,(Indent)local_214);
      kj::
      strTree<capnp::(anonymous_namespace)::Indent&,char_const(&)[8],capnp::Text::Reader&,char_const(&)[5],kj::CappedArray<char,17ul>,kj::StringTree,kj::StringTree,char_const(&)[7],int,char_const(&)[9],unsigned_short,char_const(&)[6],kj::StringTree,char_const(&)[2],kj::Array<kj::StringTree>,kj::StringTree,capnp::(anonymous_namespace)::Indent&,char_const(&)[3]>
                (__return_storage_ptr__,(kj *)((long)&this_local + 4),(Indent *)"struct ",
                 &&stack0xffffffffffffffd8,(Reader *)" @0x",(char (*) [5])&local_e0,
                 (CappedArray<char,_17UL> *)&local_118,&local_158,(StringTree *)" {  # ",
                 (char (*) [7])&local_164,(int *)" bytes, ",(char (*) [9])&local_166,
                 (unsigned_short *)" ptrs",(char (*) [6])&local_1a0,(StringTree *)0x23b62d,
                 (char (*) [2])&local_1c0,(Array<kj::StringTree> *)&local_208,
                 (StringTree *)((long)&this_local + 4),(Indent *)"}\n",in_stack_fffffffffffff430);
      kj::StringTree::~StringTree(&local_208);
      kj::Array<kj::StringTree>::~Array(&local_1c0);
      kj::StringTree::~StringTree(&local_1a0);
      kj::StringTree::~StringTree(&local_158);
      kj::StringTree::~StringTree(&local_118);
      break;
    case ENUM:
      uVar8 = capnp::schema::Node::Reader::getId((Reader *)&f);
      kj::hex(&local_238,uVar8);
      local_278 = name_local.super_StringPtr.content.size_;
      genAnnotations(&local_270,this,(Schema)name_local.super_StringPtr.content.size_);
      local_300.raw =
           (RawBrandedSchema *)Schema::asEnum((Schema *)&name_local.super_StringPtr.content.size_);
      EnumSchema::getEnumerants(&local_2f8,(EnumSchema *)&local_300);
      sortByCodeOrder<capnp::EnumSchema::EnumerantList>(&local_2c0,this,&local_2f8);
      kj::_::Mapper<kj::Array<capnp::EnumSchema::Enumerant>_>::Mapper(&local_2a8,&local_2c0);
      local_318.indent = (Indent *)((long)&this_local + 4);
      local_318.schema = (Schema *)&name_local.super_StringPtr.content.size_;
      local_318.this = this;
      kj::_::Mapper<kj::Array<capnp::EnumSchema::Enumerant>_>::
      operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnpc_capnp_c__:559:13)>
                (&local_290,&local_2a8,&local_318);
      sVar2 = name_local.super_StringPtr.content.size_;
      interface.super_Schema.raw._4_4_ = Indent::next((Indent *)((long)&this_local + 4));
      genNestedDecls(&local_350,this,(Schema)sVar2,interface.super_Schema.raw._4_4_);
      kj::
      strTree<capnp::(anonymous_namespace)::Indent&,char_const(&)[6],capnp::Text::Reader&,char_const(&)[5],kj::CappedArray<char,17ul>,kj::StringTree,char_const(&)[4],kj::Array<kj::StringTree>,kj::StringTree,capnp::(anonymous_namespace)::Indent&,char_const(&)[3]>
                (__return_storage_ptr__,(kj *)((long)&this_local + 4),(Indent *)"enum ",
                 (char (*) [6])&stack0xffffffffffffffd8,(Reader *)" @0x",(char (*) [5])&local_238,
                 (CappedArray<char,_17UL> *)&local_270,(StringTree *)" {\n",(char (*) [4])&local_290
                 ,(Array<kj::StringTree> *)&local_350,(StringTree *)((long)&this_local + 4),
                 (Indent *)"}\n",(char (*) [3])in_stack_fffffffffffff3f8);
      kj::StringTree::~StringTree(&local_350);
      kj::Array<kj::StringTree>::~Array(&local_290);
      kj::_::Mapper<kj::Array<capnp::EnumSchema::Enumerant>_>::~Mapper(&local_2a8);
      kj::Array<capnp::EnumSchema::Enumerant>::~Array(&local_2c0);
      kj::StringTree::~StringTree(&local_270);
      break;
    case INTERFACE:
      local_368.raw =
           (RawBrandedSchema *)
           Schema::asInterface((Schema *)&name_local.super_StringPtr.content.size_);
      uVar8 = capnp::schema::Node::Reader::getId((Reader *)&f);
      kj::hex(&local_388,uVar8);
      local_3c8 = name_local.super_StringPtr.content.size_;
      genGenericParams(&local_3c0,this,(Schema)name_local.super_StringPtr.content.size_);
      local_408.raw = local_368.raw;
      genSuperclasses(&local_400,this,(InterfaceSchema)local_368.raw);
      local_448 = name_local.super_StringPtr.content.size_;
      genAnnotations(&local_440,this,(Schema)name_local.super_StringPtr.content.size_);
      InterfaceSchema::getMethods(&local_4c8,(InterfaceSchema *)&local_368);
      sortByCodeOrder<capnp::InterfaceSchema::MethodList>(&local_490,this,&local_4c8);
      kj::_::Mapper<kj::Array<capnp::InterfaceSchema::Method>_>::Mapper(&local_478,&local_490);
      local_4e0.indent = (Indent *)((long)&this_local + 4);
      local_4e0.interface = (InterfaceSchema *)&local_368;
      local_4e0.this = this;
      kj::_::Mapper<kj::Array<capnp::InterfaceSchema::Method>_>::
      operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnpc_capnp_c__:574:13)>
                (&local_460,&local_478,&local_4e0);
      sVar2 = name_local.super_StringPtr.content.size_;
      constProto._reader._44_4_ = Indent::next((Indent *)((long)&this_local + 4));
      genNestedDecls(&local_518,this,(Schema)sVar2,(Indent)constProto._reader._44_4_);
      kj::
      strTree<capnp::(anonymous_namespace)::Indent&,char_const(&)[11],capnp::Text::Reader&,char_const(&)[5],kj::CappedArray<char,17ul>,kj::StringTree,kj::StringTree,kj::StringTree,char_const(&)[4],kj::Array<kj::StringTree>,kj::StringTree,capnp::(anonymous_namespace)::Indent&,char_const(&)[3]>
                (__return_storage_ptr__,(kj *)((long)&this_local + 4),(Indent *)"interface ",
                 (char (*) [11])&stack0xffffffffffffffd8,(Reader *)" @0x",(char (*) [5])&local_388,
                 (CappedArray<char,_17UL> *)&local_3c0,&local_400,&local_440,(StringTree *)" {\n",
                 (char (*) [4])&local_460,(Array<kj::StringTree> *)&local_518,
                 (StringTree *)((long)&this_local + 4),(Indent *)"}\n",in_stack_fffffffffffff408);
      kj::StringTree::~StringTree(&local_518);
      kj::Array<kj::StringTree>::~Array(&local_460);
      kj::_::Mapper<kj::Array<capnp::InterfaceSchema::Method>_>::~Mapper(&local_478);
      kj::Array<capnp::InterfaceSchema::Method>::~Array(&local_490);
      kj::StringTree::~StringTree(&local_440);
      kj::StringTree::~StringTree(&local_400);
      kj::StringTree::~StringTree(&local_3c0);
      break;
    case CONST:
      capnp::schema::Node::Reader::getConst((Reader *)local_558,(Reader *)&f);
      uVar8 = capnp::schema::Node::Reader::getId((Reader *)&f);
      kj::hex(&local_578,uVar8);
      capnp::schema::Node::Const::Reader::getType(&local_5e0,(Reader *)local_558);
      local_5e8.raw = (RawBrandedSchema *)name_local.super_StringPtr.content.size_;
      kj::Maybe<capnp::InterfaceSchema::Method>::Maybe();
      type._reader.capTable = local_5e0._reader.capTable;
      type._reader.segment = local_5e0._reader.segment;
      type._reader.data = local_5e0._reader.data;
      type._reader.pointers = local_5e0._reader.pointers;
      type._reader.dataSize = local_5e0._reader.dataSize;
      type._reader.pointerCount = local_5e0._reader.pointerCount;
      type._reader._38_2_ = local_5e0._reader._38_2_;
      type._reader.nestingLimit = local_5e0._reader.nestingLimit;
      type._reader._44_4_ = local_5e0._reader._44_4_;
      genType(&local_5b0,this,type,local_5e8,&local_630);
      local_688.raw =
           (RawBrandedSchema *)Schema::asConst((Schema *)&name_local.super_StringPtr.content.size_);
      local_680 = ConstSchema::getType((ConstSchema *)&local_688);
      capnp::schema::Node::Const::Reader::getValue(&local_6b8,(Reader *)local_558);
      value._reader.capTable = local_6b8._reader.capTable;
      value._reader.segment = local_6b8._reader.segment;
      value._reader.data = local_6b8._reader.data;
      value._reader.pointers = local_6b8._reader.pointers;
      value._reader.dataSize = local_6b8._reader.dataSize;
      value._reader.pointerCount = local_6b8._reader.pointerCount;
      value._reader._38_2_ = local_6b8._reader._38_2_;
      value._reader.nestingLimit = local_6b8._reader.nestingLimit;
      value._reader._44_4_ = local_6b8._reader._44_4_;
      genValue(&local_670,this,local_680,value);
      genAnnotations(&local_6f0,this,(Schema)name_local.super_StringPtr.content.size_);
      kj::
      strTree<capnp::(anonymous_namespace)::Indent&,char_const(&)[7],capnp::Text::Reader&,char_const(&)[5],kj::CappedArray<char,17ul>,char_const(&)[3],kj::StringTree,char_const(&)[4],kj::StringTree,kj::StringTree,char_const(&)[3]>
                (__return_storage_ptr__,(kj *)((long)&this_local + 4),(Indent *)"const ",
                 (char (*) [7])&stack0xffffffffffffffd8,(Reader *)" @0x",(char (*) [5])&local_578,
                 (CappedArray<char,_17UL> *)0x227125,(char (*) [3])&local_5b0,(StringTree *)0x2271c8
                 ,(char (*) [4])&local_670,&local_6f0,(StringTree *)";\n",
                 (char (*) [3])in_stack_fffffffffffff3f8);
      kj::StringTree::~StringTree(&local_6f0);
      kj::StringTree::~StringTree(&local_670);
      kj::StringTree::~StringTree(&local_5b0);
      kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_630);
      break;
    case ANNOTATION:
      this_00 = &targets.builder.disposer;
      capnp::schema::Node::Reader::getAnnotation((Reader *)this_00,(Reader *)&f);
      kj::Vector<kj::String>::Vector((Vector<kj::String> *)local_748,8);
      dynamic.reader._47_1_ = 1;
      toDynamic<capnp::schema::Node::Annotation::Reader&>
                ((ReaderFor<DynamicTypeFor<FromReader<Reader_&>_>_> *)&__range4,(capnp *)this_00,
                 value_00);
      __begin4._8_8_ = DynamicStruct::Reader::getSchema((Reader *)&__range4);
      StructSchema::getFields(&local_7c8,(StructSchema *)&__begin4.index);
      local_790 = &local_7c8;
      IVar11 = StructSchema::FieldList::begin(local_790);
      __end4._8_8_ = IVar11.container;
      __begin4.container._0_4_ = IVar11.index;
      local_7e0 = (undefined1  [8])__end4._8_8_;
      IVar11 = StructSchema::FieldList::end(local_790);
      delim = IVar11.container;
      __end4.container._0_4_ = IVar11.index;
      local_800 = (undefined1  [8])delim;
      while (bVar3 = _::
                     IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                     ::operator==((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                                   *)local_7e0,
                                  (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                                   *)local_800), ((bVar3 ^ 0xffU) & 1) != 0) {
        _::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
        operator*((Field *)&fieldName.super_StringPtr.content.size_,
                  (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                   *)local_7e0);
        StructSchema::Field::getProto(&local_890,(Field *)&fieldName.super_StringPtr.content.size_);
        RVar12 = capnp::schema::Field::Reader::getName(&local_890);
        fieldName.super_StringPtr.content.ptr = RVar12.super_StringPtr.content.size_;
        delim = RVar12.super_StringPtr.content.ptr;
        local_860 = (undefined1  [8])delim;
        kj::StringPtr::StringPtr(&local_8a0,"targets");
        bVar3 = kj::StringPtr::startsWith((StringPtr *)local_860,&local_8a0);
        if (bVar3) {
          target.content.disposer = (ArrayDisposer *)fieldName.super_StringPtr.content.size_;
          field_00._8_8_ = field.parent.super_Schema.raw;
          field_00.parent.super_Schema.raw = (Schema)(Schema)fieldName.super_StringPtr.content.size_
          ;
          field_00.proto._reader.segment = (SegmentReader *)field._8_8_;
          field_00.proto._reader.capTable = (CapTableReader *)field.proto._reader.segment;
          field_00.proto._reader.data = field.proto._reader.capTable;
          field_00.proto._reader.pointers = (WirePointer *)field.proto._reader.data;
          field_00.proto._reader._32_8_ = field.proto._reader.pointers;
          field_00.proto._reader._40_8_ = field.proto._reader._32_8_;
          in_stack_fffffffffffff3f8 = field.proto._reader.pointers;
          DynamicStruct::Reader::get(&local_8e8,(Reader *)&__range4,field_00);
          RVar4 = DynamicValue::Reader::as<bool>(&local_8e8);
          DynamicValue::Reader::~Reader(&local_8e8);
          if (RVar4) {
            SVar13 = kj::StringPtr::slice((StringPtr *)local_860,7);
            local_950.content.size_ = SVar13.content.size_;
            pcVar9 = SVar13.content.ptr;
            local_950.content.ptr = pcVar9;
            kj::str<kj::StringPtr>((String *)local_940,&local_950);
            pcVar10 = kj::String::operator[]((String *)local_940,0);
            cVar1 = *pcVar10;
            pcVar10 = kj::String::operator[]((String *)local_940,0);
            delim = (FieldList *)CONCAT71((int7)((ulong)pcVar9 >> 8),cVar1 + ' ');
            *pcVar10 = cVar1 + ' ';
            params = kj::mv<kj::String>((String *)local_940);
            kj::Vector<kj::String>::add<kj::String>((Vector<kj::String> *)local_748,params);
            kj::String::~String((String *)local_940);
          }
          else {
            dynamic.reader._47_1_ = 0;
          }
        }
        _::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
        operator++((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                    *)local_7e0);
      }
      if ((dynamic.reader._47_1_ & 1) != 0) {
        kj::Vector<kj::String>::Vector(&local_970,1);
        kj::Vector<kj::String>::operator=((Vector<kj::String> *)local_748,&local_970);
        kj::Vector<kj::String>::~Vector(&local_970);
        kj::heapString(&local_988,"*");
        kj::Vector<kj::String>::add<kj::String>((Vector<kj::String> *)local_748,&local_988);
        kj::String::~String(&local_988);
      }
      uVar8 = capnp::schema::Node::Reader::getId((Reader *)&f);
      kj::hex(&local_9a8,uVar8);
      kj::strArray<kj::Vector<kj::String>&>
                (&local_9c0,(kj *)local_748,(Vector<kj::String> *)0x2270d6,(char *)delim);
      capnp::schema::Node::Annotation::Reader::getType
                (&local_a28,(Reader *)&targets.builder.disposer);
      local_a30.raw = (RawBrandedSchema *)name_local.super_StringPtr.content.size_;
      kj::Maybe<capnp::InterfaceSchema::Method>::Maybe(&local_a78);
      type_00._reader.capTable = local_a28._reader.capTable;
      type_00._reader.segment = local_a28._reader.segment;
      type_00._reader.data = local_a28._reader.data;
      type_00._reader.pointers = local_a28._reader.pointers;
      type_00._reader.dataSize = local_a28._reader.dataSize;
      type_00._reader.pointerCount = local_a28._reader.pointerCount;
      type_00._reader._38_2_ = local_a28._reader._38_2_;
      type_00._reader.nestingLimit = local_a28._reader.nestingLimit;
      type_00._reader._44_4_ = local_a28._reader._44_4_;
      genType(&local_9f8,this,type_00,local_a30,&local_a78);
      genAnnotations(&local_ab8,this,(Schema)name_local.super_StringPtr.content.size_);
      kj::
      strTree<capnp::(anonymous_namespace)::Indent&,char_const(&)[12],capnp::Text::Reader&,char_const(&)[5],kj::CappedArray<char,17ul>,char_const(&)[3],kj::String,char_const(&)[4],kj::StringTree,kj::StringTree,char_const(&)[3]>
                (__return_storage_ptr__,(kj *)((long)&this_local + 4),(Indent *)"annotation ",
                 (char (*) [12])&stack0xffffffffffffffd8,(Reader *)" @0x",(char (*) [5])&local_9a8,
                 (CappedArray<char,_17UL> *)" (",(char (*) [3])&local_9c0,(String *)") :",
                 (char (*) [4])&local_9f8,&local_ab8,(StringTree *)";\n",
                 (char (*) [3])in_stack_fffffffffffff3f8);
      kj::StringTree::~StringTree(&local_ab8);
      kj::StringTree::~StringTree(&local_9f8);
      kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe(&local_a78);
      kj::String::~String(&local_9c0);
      kj::Vector<kj::String>::~Vector((Vector<kj::String> *)local_748);
      break;
    default:
      kj::strTree<>();
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
            (&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnpc-capnp.c++"
             ,0x214,FAILED,(char *)0x0,"\"Aliases not implemented.\"",
             (char (*) [25])"Aliases not implemented.");
  kj::_::Debug::Fault::fatal(&local_78);
}

Assistant:

kj::StringTree genDecl(Schema schema, Text::Reader name, uint64_t scopeId, Indent indent) {
    auto proto = schema.getProto();
    if (proto.getScopeId() != scopeId) {
      // This appears to be an alias for something declared elsewhere.
      KJ_FAIL_REQUIRE("Aliases not implemented.");
    }

    switch (proto.which()) {
      case schema::Node::FILE:
        KJ_FAIL_REQUIRE("Encountered nested file node.");
        break;
      case schema::Node::STRUCT: {
        auto structProto = proto.getStruct();
        return kj::strTree(
            indent, "struct ", name,
            " @0x", kj::hex(proto.getId()), genGenericParams(schema),
            genAnnotations(schema), " {  # ",
            structProto.getDataWordCount() * 8, " bytes, ",
            structProto.getPointerCount(), " ptrs",
            structProto.getPreferredListEncoding() == schema::ElementSize::INLINE_COMPOSITE
                ? kj::strTree()
                : kj::strTree(", packed as ",
                              elementSizeName(structProto.getPreferredListEncoding())),
            "\n",
            genStructFields(schema.asStruct(), indent.next()),
            genNestedDecls(schema, indent.next()),
            indent, "}\n");
      }
      case schema::Node::ENUM: {
        return kj::strTree(
            indent, "enum ", name, " @0x", kj::hex(proto.getId()), genAnnotations(schema), " {\n",
            KJ_MAP(enumerant, sortByCodeOrder(schema.asEnum().getEnumerants())) {
              return kj::strTree(indent.next(), enumerant.getProto().getName(), " @",
                                 enumerant.getIndex(),
                                 genAnnotations(enumerant.getProto().getAnnotations(), schema),
                                 ";\n");
            },
            genNestedDecls(schema, indent.next()),
            indent, "}\n");
      }
      case schema::Node::INTERFACE: {
        auto interface = schema.asInterface();
        return kj::strTree(
            indent, "interface ", name, " @0x", kj::hex(proto.getId()), genGenericParams(schema),
            genSuperclasses(interface),
            genAnnotations(schema), " {\n",
            KJ_MAP(method, sortByCodeOrder(interface.getMethods())) {
              auto methodProto = method.getProto();

              auto implicits = methodProto.getImplicitParameters();
              kj::StringTree implicitsStr;
              if (implicits.size() > 0) {
                implicitsStr = kj::strTree(
                    "[", kj::StringTree(KJ_MAP(implicit, implicits) {
                      return kj::strTree(implicit.getName());
                    }, ", "), "] ");
              }

              auto params = schemaLoader.get(methodProto.getParamStructType()).asStruct();
              auto results = schemaLoader.get(methodProto.getResultStructType()).asStruct();
              return kj::strTree(
                  indent.next(), methodProto.getName(),
                  " @", method.getIndex(), " ", kj::mv(implicitsStr),
                  genParamList(interface, params, methodProto.getParamBrand(), method), " -> ",
                  genParamList(interface, results, methodProto.getResultBrand(), method),
                  genAnnotations(methodProto.getAnnotations(), interface), ";\n");
            },
            genNestedDecls(schema, indent.next()),
            indent, "}\n");
      }
      case schema::Node::CONST: {
        auto constProto = proto.getConst();
        return kj::strTree(
            indent, "const ", name, " @0x", kj::hex(proto.getId()), " :",
            genType(constProto.getType(), schema, kj::none), " = ",
            genValue(schema.asConst().getType(), constProto.getValue()),
            genAnnotations(schema), ";\n");
      }
      case schema::Node::ANNOTATION: {
        auto annotationProto = proto.getAnnotation();

        kj::Vector<kj::String> targets(8);
        bool targetsAll = true;

        auto dynamic = toDynamic(annotationProto);
        for (auto field: dynamic.getSchema().getFields()) {
          auto fieldName = field.getProto().getName();
          if (fieldName.startsWith("targets")) {
            if (dynamic.get(field).as<bool>()) {
              auto target = kj::str(fieldName.slice(strlen("targets")));
              target[0] = target[0] - 'A' + 'a';
              targets.add(kj::mv(target));
            } else {
              targetsAll = false;
            }
          }
        }

        if (targetsAll) {
          targets = kj::Vector<kj::String>(1);
          targets.add(kj::heapString("*"));
        }

        return kj::strTree(
            indent, "annotation ", name, " @0x", kj::hex(proto.getId()),
            " (", strArray(targets, ", "), ") :",
            genType(annotationProto.getType(), schema, kj::none), genAnnotations(schema), ";\n");
      }
    }

    return kj::strTree();
  }